

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int luaL_checkoption(lua_State *L,int idx,char *def,char **lst)

{
  int iVar1;
  char *local_38;
  char *s;
  ptrdiff_t i;
  char **lst_local;
  char *def_local;
  int idx_local;
  lua_State *L_local;
  
  local_38 = lua_tolstring(L,idx,(size_t *)0x0);
  if ((local_38 == (char *)0x0) && (local_38 = def, def == (char *)0x0)) {
    lj_err_argt(L,idx,4);
  }
  s = (char *)0x0;
  while( true ) {
    if (lst[(long)s] == (char *)0x0) {
      lj_err_argv(L,idx,LJ_ERR_INVOPTM,local_38);
    }
    iVar1 = strcmp(lst[(long)s],local_38);
    if (iVar1 == 0) break;
    s = s + 1;
  }
  return (int)s;
}

Assistant:

LUALIB_API int luaL_checkoption(lua_State *L, int idx, const char *def,
				const char *const lst[])
{
  ptrdiff_t i;
  const char *s = lua_tolstring(L, idx, NULL);
  if (s == NULL && (s = def) == NULL)
    lj_err_argt(L, idx, LUA_TSTRING);
  for (i = 0; lst[i]; i++)
    if (strcmp(lst[i], s) == 0)
      return (int)i;
  lj_err_argv(L, idx, LJ_ERR_INVOPTM, s);
}